

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O1

void ot::commissioner::ComputeBloomFilter(ByteArray *aOut,ByteArray *aIn)

{
  byte *pbVar1;
  uint8_t aByte;
  uint8_t *puVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  uint8_t *puVar6;
  Crc16 ansi;
  Crc16 ccitt;
  Crc16 local_40;
  Crc16 local_3c;
  ByteArray *local_38;
  
  Crc16::Crc16(&local_3c,kCcitt);
  Crc16::Crc16(&local_40,kAnsi);
  lVar4 = (long)(aOut->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(aOut->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    __assert_fail("!aOut.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/bloom_filter.cpp"
                  ,0x37,"void ot::commissioner::ComputeBloomFilter(ByteArray &, const ByteArray &)")
    ;
  }
  uVar5 = lVar4 * 8;
  local_38 = aOut;
  if (uVar5 < 0x100) {
    puVar6 = (aIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (aIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar6 != puVar2) {
      do {
        aByte = *puVar6;
        Crc16::Update(&local_3c,aByte);
        Crc16::Update(&local_40,aByte);
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar2);
    }
    bVar3 = (byte)((ulong)local_3c.mCrc % uVar5);
    pbVar1 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + (char)~(bVar3 >> 3);
    *pbVar1 = *pbVar1 | '\x01' << (bVar3 & 7);
    bVar3 = (byte)((ulong)local_40.mCrc % uVar5);
    pbVar1 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + (char)~(bVar3 >> 3);
    *pbVar1 = *pbVar1 | '\x01' << (bVar3 & 7);
    return;
  }
  __assert_fail("numBits <= std::numeric_limits<uint8_t>::max()",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/bloom_filter.cpp"
                ,0x38,"void ot::commissioner::ComputeBloomFilter(ByteArray &, const ByteArray &)");
}

Assistant:

void ComputeBloomFilter(ByteArray &aOut, const ByteArray &aIn)
{
    Crc16 ccitt(Crc16::Polynomial::kCcitt);
    Crc16 ansi(Crc16::Polynomial::kAnsi);

    const size_t numBits = aOut.size() * 8;

    assert(!aOut.empty());
    assert(numBits <= std::numeric_limits<uint8_t>::max());

    for (auto byte : aIn)
    {
        ccitt.Update(byte);
        ansi.Update(byte);
    }

    SetBit(aOut, ccitt.Get() % numBits);
    SetBit(aOut, ansi.Get() % numBits);
}